

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateSimplifiedInt4Rem(Lowerer *this,Instr *remInstr,LabelInstr *skipBailOutLabel)

{
  undefined2 uVar1;
  Opnd *this_00;
  Opnd *src1;
  Opnd *this_01;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  OpCode OVar5;
  BailOutKind BVar6;
  uint sourceContextId;
  uint functionId;
  uint uVar7;
  int32 iVar8;
  undefined4 *puVar9;
  IntConstOpnd *pIVar10;
  LabelInstr *target;
  IntConstOpnd *src2;
  LabelInstr *local_40;
  
  if (remInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6768,"(remInstr)","remInstr");
    if (!bVar3) goto LAB_0054e977;
    *puVar9 = 0;
  }
  uVar1 = remInstr->m_opcode;
  if (1 < (ushort)(uVar1 - 0x1c5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6769,
                       "(remInstr->m_opcode == Js::OpCode::Rem_I4 || remInstr->m_opcode == Js::OpCode::RemU_I4)"
                       ,
                       "remInstr->m_opcode == Js::OpCode::Rem_I4 || remInstr->m_opcode == Js::OpCode::RemU_I4"
                      );
    if (!bVar3) goto LAB_0054e977;
    *puVar9 = 0;
  }
  this_00 = remInstr->m_dst;
  src1 = remInstr->m_src1;
  this_01 = remInstr->m_src2;
  if (src1 == (Opnd *)0x0 || this_01 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x676d,"(src1 && src2)","src1 && src2");
    if (!bVar3) goto LAB_0054e977;
    *puVar9 = 0;
  }
  bVar3 = IR::Opnd::IsRegOpnd(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x676e,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar3) goto LAB_0054e977;
    *puVar9 = 0;
  }
  if ((remInstr->field_0x38 & 0x10) == 0) {
    bVar3 = false;
  }
  else {
    BVar6 = IR::Instr::GetBailOutKind(remInstr);
    bVar3 = BVar6 == BailOnModByPowerOf2;
  }
  sourceContextId = Func::GetSourceContextId(remInstr->m_func->topFunc);
  functionId = Func::GetLocalFunctionId(remInstr->m_func->topFunc);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,MathFastPathPhase,sourceContextId,functionId);
  if ((bVar3 == false) && (bVar4)) {
    return false;
  }
  bVar4 = IR::Opnd::IsIntConstOpnd(this_01);
  if (bVar4) {
    pIVar10 = IR::Opnd::AsIntConstOpnd(this_01);
    uVar7 = IR::IntConstOpnd::AsInt32(pIVar10);
    if (((uVar7 + 0x7fffffff & uVar7) != 0 || (int)uVar7 < 1) && bVar3 == false) {
      return false;
    }
  }
  else if (bVar3 == false) {
    return false;
  }
  local_40 = skipBailOutLabel;
  if (skipBailOutLabel == (LabelInstr *)0x0) {
    local_40 = IR::LabelInstr::New(Label,remInstr->m_func,false);
    IR::Instr::InsertAfter(remInstr,&local_40->super_Instr);
  }
  target = IR::LabelInstr::New(Label,remInstr->m_func,bVar3);
  IR::Instr::InsertBefore(remInstr,&target->super_Instr);
  InsertTest(src1,src1,&target->super_Instr);
  OVar5 = LowererMD::MDCompareWithZeroBranchOpcode(BrLt_A);
  InsertBranch(OVar5,target,&target->super_Instr);
  if (bVar3 == false) {
    bVar3 = IR::Opnd::IsIntConstOpnd(this_01);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x67ad,"(src2->IsIntConstOpnd())","src2->IsIntConstOpnd()");
      if (!bVar3) {
LAB_0054e977:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    pIVar10 = IR::Opnd::AsIntConstOpnd(this_01);
    iVar8 = IR::IntConstOpnd::AsInt32(pIVar10);
    pIVar10 = IR::IntConstOpnd::New((long)(iVar8 + -1),TyInt32,remInstr->m_func,false);
  }
  else {
    pIVar10 = (IntConstOpnd *)IR::RegOpnd::New(TyInt32,remInstr->m_func);
    InsertMove((Opnd *)pIVar10,this_01,&target->super_Instr,true);
    src2 = IR::IntConstOpnd::New(1,TyInt32,this->m_func,true);
    InsertSub(true,(Opnd *)pIVar10,(Opnd *)pIVar10,&src2->super_Opnd,&target->super_Instr);
    OVar5 = LowererMD::MDCompareWithZeroBranchOpcode(BrLt_A);
    InsertBranch(OVar5,target,&target->super_Instr);
    InsertTestBranch(this_01,(Opnd *)pIVar10,BrNeq_A,target,&target->super_Instr);
  }
  InsertAnd(this_00,src1,&pIVar10->super_Opnd,&target->super_Instr);
  InsertBranch(Br,local_40,&target->super_Instr);
  return true;
}

Assistant:

bool
Lowerer::GenerateSimplifiedInt4Rem(
    IR::Instr *const remInstr,
    IR::LabelInstr *const skipBailOutLabel) const
{
    Assert(remInstr);
    Assert(remInstr->m_opcode == Js::OpCode::Rem_I4 || remInstr->m_opcode == Js::OpCode::RemU_I4);

    auto *dst = remInstr->GetDst(), *src1 = remInstr->GetSrc1(), *src2 = remInstr->GetSrc2();

    Assert(src1 && src2);
    Assert(dst->IsRegOpnd());

    bool isModByPowerOf2 = (remInstr->HasBailOutInfo() && remInstr->GetBailOutKind() == IR::BailOnModByPowerOf2);

    if (PHASE_OFF(Js::Phase::MathFastPathPhase, remInstr->m_func->GetTopFunc()) && !isModByPowerOf2)
        return false;

    if (!(src2->IsIntConstOpnd() && Math::IsPow2(src2->AsIntConstOpnd()->AsInt32())) && !isModByPowerOf2)
    {
        return false;
    }
    // We have:
    //     s3 = s1 % s2 , where s2 = +2^i
    //
    // Generate:
    //     test s1, s1
    //     js   $slowPathLabel
    //     s3 = and s1, 0x00..fff  (2^i - 1)
    //     jmp  $doneLabel
    //   $slowPathLabel:
    //     (Slow path)
    //     (Neg zero check)
    //     (Bailout code)
    //   $doneLabel:

    IR::LabelInstr *doneLabel = skipBailOutLabel, *slowPathLabel;

    if (!doneLabel)
    {
        doneLabel = IR::LabelInstr::New(Js::OpCode::Label, remInstr->m_func);
        remInstr->InsertAfter(doneLabel);
    }
    slowPathLabel = IR::LabelInstr::New(Js::OpCode::Label, remInstr->m_func, isModByPowerOf2);
    remInstr->InsertBefore(slowPathLabel);

    // test s1, s1
    InsertTest(src1, src1, slowPathLabel);

    // jsb $slowPathLabel
    InsertBranch(LowererMD::MDCompareWithZeroBranchOpcode(Js::OpCode::BrLt_A), slowPathLabel, slowPathLabel);

    // s3 = and s1, 0x00..fff (2^i - 1)
    IR::Opnd* maskOpnd;

    if(isModByPowerOf2)
    {
        Assert(isModByPowerOf2);
        maskOpnd = IR::RegOpnd::New(TyInt32, remInstr->m_func);

        // mov maskOpnd, s2
        InsertMove(maskOpnd, src2, slowPathLabel);

        // dec maskOpnd
        InsertSub(/*needFlags*/ true, maskOpnd, maskOpnd, IR::IntConstOpnd::New(1, TyInt32, this->m_func, /*dontEncode*/true), slowPathLabel);

        // maskOpnd < 0 goto $slowPath
        InsertBranch(LowererMD::MDCompareWithZeroBranchOpcode(Js::OpCode::BrLt_A), slowPathLabel, slowPathLabel);

        // TEST src2, maskOpnd
        InsertTestBranch(src2, maskOpnd, Js::OpCode::BrNeq_A, slowPathLabel, slowPathLabel);
    }
    else
    {
        Assert(src2->IsIntConstOpnd());
        int32 mask =  src2->AsIntConstOpnd()->AsInt32() - 1;
        maskOpnd = IR::IntConstOpnd::New(mask, TyInt32, remInstr->m_func);
    }

    // dst = src1 & maskOpnd
    InsertAnd(dst, src1, maskOpnd, slowPathLabel);

    // jmp $doneLabel
    InsertBranch(Js::OpCode::Br, doneLabel, slowPathLabel);
    return true;
}